

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::push_back(SmallVector<Resource,_8UL> *this,Resource *t)

{
  size_t *psVar1;
  ulong uVar2;
  Resource *pRVar3;
  ulong uVar4;
  long lVar5;
  Resource *__ptr;
  size_t i;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = (this->super_VectorView<Resource>).buffer_size;
  uVar6 = sVar7 + 1;
  if (uVar6 >> 0x3a == 0) {
    uVar4 = this->buffer_capacity;
    if (uVar4 < uVar6) {
      uVar2 = 8;
      if (8 < uVar4) {
        uVar2 = uVar4;
      }
      do {
        uVar4 = uVar2;
        uVar2 = uVar4 * 2;
      } while (uVar4 < uVar6);
      if (uVar4 < 9) {
        pRVar3 = (Resource *)&this->stack_storage;
      }
      else {
        pRVar3 = (Resource *)malloc(uVar4 << 6);
        if (pRVar3 == (Resource *)0x0) goto LAB_001ff351;
      }
      __ptr = (this->super_VectorView<Resource>).ptr;
      if (pRVar3 != __ptr) {
        lVar5 = 0;
        for (uVar6 = 0; uVar6 < sVar7; uVar6 = uVar6 + 1) {
          CompilerMSL::analyze_argument_buffers::Resource::Resource
                    ((Resource *)((long)&pRVar3->var + lVar5),
                     (Resource *)((long)&((this->super_VectorView<Resource>).ptr)->var + lVar5));
          ::std::__cxx11::string::~string
                    ((string *)
                     ((long)&((this->super_VectorView<Resource>).ptr)->discrete_descriptor_alias +
                     lVar5));
          sVar7 = (this->super_VectorView<Resource>).buffer_size;
          lVar5 = lVar5 + 0x40;
        }
        __ptr = (this->super_VectorView<Resource>).ptr;
      }
      if (__ptr != (Resource *)&this->stack_storage) {
        free(__ptr);
        sVar7 = (this->super_VectorView<Resource>).buffer_size;
      }
      (this->super_VectorView<Resource>).ptr = pRVar3;
      this->buffer_capacity = uVar4;
    }
    else {
      pRVar3 = (this->super_VectorView<Resource>).ptr;
    }
    CompilerMSL::analyze_argument_buffers::Resource::Resource((Resource *)(pRVar3 + sVar7),t);
    psVar1 = &(this->super_VectorView<Resource>).buffer_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
LAB_001ff351:
  ::std::terminate();
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}